

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_verify.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  FILE *pFVar4;
  size_t sVar5;
  mbedtls_md_info_t *md_info;
  ulong uVar6;
  char *__format;
  char *pcVar7;
  int c;
  uchar hash [32];
  mbedtls_rsa_context rsa;
  char filename [512];
  uchar buf [1024];
  
  mbedtls_rsa_init(&rsa,0,0);
  if (argc == 2) {
    printf("\n  . Reading public key from rsa_pub.txt");
    fflush(_stdout);
    pFVar4 = fopen("rsa_pub.txt","rb");
    if (pFVar4 == (FILE *)0x0) {
      pcVar7 = " failed\n  ! Could not open rsa_pub.txt\n  ! Please run rsa_genkey first\n";
      goto LAB_00106343;
    }
    uVar1 = mbedtls_mpi_read_file(&rsa.N,0x10,(FILE *)pFVar4);
    if (uVar1 == 0) {
      uVar1 = mbedtls_mpi_read_file(&rsa.E,0x10,(FILE *)pFVar4);
      if (uVar1 != 0) goto LAB_00106319;
      sVar5 = mbedtls_mpi_bitlen(&rsa.N);
      rsa.len = sVar5 + 7 >> 3;
      fclose(pFVar4);
      snprintf(filename,0x200,"%s.sig");
      pFVar4 = fopen(filename,"rb");
      if (pFVar4 == (FILE *)0x0) {
        __format = "\n  ! Could not open %s\n\n";
        pcVar7 = filename;
LAB_00106460:
        printf(__format,pcVar7);
      }
      else {
        uVar6 = 0;
        while( true ) {
          iVar2 = __isoc99_fscanf(pFVar4,"%02X",&c);
          if ((iVar2 < 1) || (0x3ff < uVar6)) break;
          buf[uVar6] = (uchar)c;
          uVar6 = uVar6 + 1;
        }
        fclose(pFVar4);
        if (rsa.len != uVar6) {
          pcVar7 = "\n  ! Invalid RSA signature format\n";
          goto LAB_00106343;
        }
        printf("\n  . Verifying the RSA/SHA-256 signature");
        fflush(_stdout);
        md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
        iVar2 = mbedtls_md_file(md_info,argv[1],hash);
        if (iVar2 != 0) {
          pcVar7 = argv[1];
          __format = " failed\n  ! Could not open or read %s\n\n";
          goto LAB_00106460;
        }
        iVar2 = 0;
        iVar3 = mbedtls_rsa_pkcs1_verify
                          (&rsa,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0,0,
                           MBEDTLS_MD_SHA256,0x14,hash,buf);
        if (iVar3 == 0) {
          puts("\n  . OK (the signature is valid)\n");
          goto LAB_0010634b;
        }
        printf(" failed\n  ! mbedtls_rsa_pkcs1_verify returned -0x%0x\n\n",(ulong)(uint)-iVar3);
      }
    }
    else {
LAB_00106319:
      printf(" failed\n  ! mbedtls_mpi_read_file returned %d\n\n",(ulong)uVar1);
      fclose(pFVar4);
    }
  }
  else {
    pcVar7 = "usage: rsa_verify <filename>";
LAB_00106343:
    puts(pcVar7);
  }
  iVar2 = 1;
LAB_0010634b:
  mbedtls_rsa_free(&rsa);
  return iVar2;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int ret = 1, c;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    size_t i;
    mbedtls_rsa_context rsa;
    unsigned char hash[32];
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    char filename[512];

    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );

    if( argc != 2 )
    {
        mbedtls_printf( "usage: rsa_verify <filename>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        goto exit;
    }

    mbedtls_printf( "\n  . Reading public key from rsa_pub.txt" );
    fflush( stdout );

    if( ( f = fopen( "rsa_pub.txt", "rb" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! Could not open rsa_pub.txt\n" \
                "  ! Please run rsa_genkey first\n\n" );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_read_file( &rsa.N, 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.E, 16, f ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_file returned %d\n\n", ret );
        fclose( f );
        goto exit;
    }

    rsa.len = ( mbedtls_mpi_bitlen( &rsa.N ) + 7 ) >> 3;

    fclose( f );

    /*
     * Extract the RSA signature from the text file
     */
    mbedtls_snprintf( filename, sizeof(filename), "%s.sig", argv[1] );

    if( ( f = fopen( filename, "rb" ) ) == NULL )
    {
        mbedtls_printf( "\n  ! Could not open %s\n\n", filename );
        goto exit;
    }

    i = 0;
    while( fscanf( f, "%02X", &c ) > 0 &&
           i < (int) sizeof( buf ) )
        buf[i++] = (unsigned char) c;

    fclose( f );

    if( i != rsa.len )
    {
        mbedtls_printf( "\n  ! Invalid RSA signature format\n\n" );
        goto exit;
    }

    /*
     * Compute the SHA-256 hash of the input file and
     * verify the signature
     */
    mbedtls_printf( "\n  . Verifying the RSA/SHA-256 signature" );
    fflush( stdout );

    if( ( ret = mbedtls_md_file(
                    mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 ),
                    argv[1], hash ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! Could not open or read %s\n\n", argv[1] );
        goto exit;
    }

    if( ( ret = mbedtls_rsa_pkcs1_verify( &rsa, NULL, NULL, MBEDTLS_RSA_PUBLIC,
                                  MBEDTLS_MD_SHA256, 20, hash, buf ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_pkcs1_verify returned -0x%0x\n\n", -ret );
        goto exit;
    }

    mbedtls_printf( "\n  . OK (the signature is valid)\n\n" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

    mbedtls_rsa_free( &rsa );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}